

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O3

void __thiscall TPZFrontNonSym<double>::Compress(TPZFrontNonSym<double> *this)

{
  long *plVar1;
  long *plVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  TPZStack<long,_10> from;
  TPZManVector<long,_10> TStack_88;
  
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&TStack_88);
  lVar6 = (this->super_TPZFront<double>).fFront;
  if (0 < lVar6) {
    lVar10 = 0;
    do {
      if ((this->super_TPZFront<double>).fGlobal.super_TPZVec<long>.fStore[lVar10] != -1) {
        TPZStack<long,_10>::Push((TPZStack<long,_10> *)&TStack_88,lVar10);
        lVar6 = (this->super_TPZFront<double>).fFront;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < lVar6);
  }
  if (TStack_88.super_TPZVec<long>.fNElements < 1) {
    lVar6 = 0;
  }
  else {
    plVar1 = (this->super_TPZFront<double>).fGlobal.super_TPZVec<long>.fStore;
    plVar2 = (this->super_TPZFront<double>).fLocal.fStore;
    lVar10 = 0;
    do {
      lVar6 = plVar1[TStack_88.super_TPZVec<long>.fStore[lVar10]];
      plVar1[lVar10] = lVar6;
      plVar2[lVar6] = lVar10;
      lVar10 = lVar10 + 1;
      lVar6 = TStack_88.super_TPZVec<long>.fNElements;
    } while (TStack_88.super_TPZVec<long>.fNElements != lVar10);
  }
  if (lVar6 < (this->super_TPZFront<double>).fGlobal.super_TPZVec<long>.fNElements) {
    plVar1 = (this->super_TPZFront<double>).fGlobal.super_TPZVec<long>.fStore;
    do {
      plVar1[lVar6] = -1;
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->super_TPZFront<double>).fGlobal.super_TPZVec<long>.fNElements);
  }
  if ((this->super_TPZFront<double>).fFree.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements
      + TStack_88.super_TPZVec<long>.fNElements != (this->super_TPZFront<double>).fFront) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TPZFront.Compress inconsistent data structure\n",0x2e);
  }
  (this->super_TPZFront<double>).fFront = TStack_88.super_TPZVec<long>.fNElements;
  TPZManVector<int,_10>::Resize(&(this->super_TPZFront<double>).fFree.super_TPZManVector<int,_10>,0)
  ;
  TPZManVector<long,_10>::Resize
            (&(this->super_TPZFront<double>).fGlobal,(this->super_TPZFront<double>).fFront);
  if ((this->super_TPZFront<double>).fData.fNElements != 0 &&
      0 < TStack_88.super_TPZVec<long>.fNElements) {
    lVar6 = (long)(this->super_TPZFront<double>).fMaxFront;
    pdVar3 = (this->super_TPZFront<double>).fData.fStore;
    lVar10 = 0;
    pdVar7 = pdVar3;
    do {
      lVar4 = TStack_88.super_TPZVec<long>.fStore[lVar10];
      lVar8 = lVar4 * lVar6;
      lVar9 = 0;
      do {
        lVar5 = TStack_88.super_TPZVec<long>.fStore[lVar9];
        pdVar7[lVar9] = pdVar3[lVar8 + lVar5];
        if (lVar9 != lVar5 || lVar4 != lVar10) {
          pdVar3[lVar8 + lVar5] = 0.0;
        }
        lVar9 = lVar9 + 1;
      } while (TStack_88.super_TPZVec<long>.fNElements != lVar9);
      lVar10 = lVar10 + 1;
      pdVar7 = pdVar7 + lVar6;
    } while (lVar10 != TStack_88.super_TPZVec<long>.fNElements);
  }
  TPZManVector<long,_10>::~TPZManVector(&TStack_88);
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::Compress(){
	//	PrintGlobal("Before COmpress");
	//	Print("Before Compress", cout);
	TPZStack <int64_t> from;
	int64_t nfound;
	int64_t i, j;
	for(i = 0; i < this->fFront; i++){
		if(this->fGlobal[i] != -1) from.Push(i);
	}
	
	/**
	 *First this->fLocal initialization
	 *Any needed updates is done on next loop
	 */
	nfound = from.NElements();
	for(i=0;i<nfound;i++) {
		this->fGlobal[i]=this->fGlobal[from[i]];
		//this->fGlobal[from[i]] = -1;
		this->fLocal[this->fGlobal[i]] = i;
	}
	for(;i<this->fGlobal.NElements();i++) this->fGlobal[i] = -1;
	
	if(nfound+this->fFree.NElements()!=this->fFront) cout << "TPZFront.Compress inconsistent data structure\n";
	
	this->fFront = nfound;
	this->fFree.Resize(0);	
	this->fGlobal.Resize(this->fFront);
	if(this->fData.NElements()==0) return;
	
	for(j = 0; j < nfound; j++){
		for(i = 0; i < nfound; i++){
			Element(i,j) = Element(from[i], from[j]);
			if(from[i]!=i || from[j]!=j) Element(from[i],from[j])=0.;
		}
	}
}